

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

Ref<glTF::Node> FindSkeletonRootJoint(Ref<glTF::Skin> *skinRef)

{
  byte bVar1;
  Skin *pSVar2;
  reference pvVar3;
  Node *pNVar4;
  Ref<glTF::Node> RVar5;
  undefined1 local_30 [8];
  Ref<glTF::Node> startNodeRef;
  Ref<glTF::Skin> *skinRef_local;
  Ref<glTF::Node> parentNodeRef;
  
  startNodeRef._8_8_ = skinRef;
  glTF::Ref<glTF::Node>::Ref((Ref<glTF::Node> *)local_30);
  glTF::Ref<glTF::Node>::Ref((Ref<glTF::Node> *)&skinRef_local);
  pSVar2 = glTF::Ref<glTF::Skin>::operator->((Ref<glTF::Skin> *)startNodeRef._8_8_);
  pvVar3 = std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::operator[]
                     (&pSVar2->jointNames,0);
  local_30 = (undefined1  [8])pvVar3->vector;
  startNodeRef.vector._0_4_ = pvVar3->index;
  pSVar2 = glTF::Ref<glTF::Skin>::operator->((Ref<glTF::Skin> *)startNodeRef._8_8_);
  pvVar3 = std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::operator[]
                     (&pSVar2->jointNames,0);
  skinRef_local = (Ref<glTF::Skin> *)pvVar3->vector;
  parentNodeRef.vector._0_4_ = pvVar3->index;
  do {
    local_30 = (undefined1  [8])skinRef_local;
    startNodeRef.vector._0_4_ = (uint)parentNodeRef.vector;
    pNVar4 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_30);
    skinRef_local = (Ref<glTF::Skin> *)(pNVar4->parent).vector;
    parentNodeRef.vector._0_4_ = (pNVar4->parent).index;
    glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)&skinRef_local);
    bVar1 = std::__cxx11::string::empty();
  } while (((bVar1 ^ 0xff) & 1) != 0);
  RVar5.index = (uint)parentNodeRef.vector;
  RVar5.vector = (vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)skinRef_local;
  RVar5._12_4_ = 0;
  return RVar5;
}

Assistant:

Ref<Node> FindSkeletonRootJoint(Ref<Skin>& skinRef)
{
    Ref<Node> startNodeRef;
    Ref<Node> parentNodeRef;

    // Arbitrarily use the first joint to start the search.
    startNodeRef = skinRef->jointNames[0];
    parentNodeRef = skinRef->jointNames[0];

    do {
        startNodeRef = parentNodeRef;
        parentNodeRef = startNodeRef->parent;
    } while (!parentNodeRef->jointName.empty());

    return parentNodeRef;
}